

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QTableWidgetItem_*>::insert
          (QPodArrayOps<QTableWidgetItem_*> *this,qsizetype i,qsizetype n,parameter_type t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  QTableWidgetItem **ppQVar3;
  ulong uVar4;
  GrowthPosition where;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QTableWidgetItem_*>).size != 0);
  QArrayDataPointer<QTableWidgetItem_*>::detachAndGrow
            (&this->super_QArrayDataPointer<QTableWidgetItem_*>,where,n,(QTableWidgetItem ***)0x0,
             (QArrayDataPointer<QTableWidgetItem_*> *)0x0);
  ppQVar3 = createHole(this,where,i,n);
  auVar2 = _DAT_00660670;
  auVar1 = _DAT_00660660;
  if (n != 0) {
    lVar5 = n + -1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar4 = 0;
    auVar6 = auVar6 ^ _DAT_00660670;
    do {
      auVar7._8_4_ = (int)uVar4;
      auVar7._0_8_ = uVar4;
      auVar7._12_4_ = (int)(uVar4 >> 0x20);
      auVar7 = (auVar7 | auVar1) ^ auVar2;
      if ((bool)(~(auVar7._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar7._0_4_ ||
                  auVar6._4_4_ < auVar7._4_4_) & 1)) {
        ppQVar3[uVar4] = t;
      }
      if ((auVar7._12_4_ != auVar6._12_4_ || auVar7._8_4_ <= auVar6._8_4_) &&
          auVar7._12_4_ <= auVar6._12_4_) {
        ppQVar3[uVar4 + 1] = t;
      }
      uVar4 = uVar4 + 2;
    } while ((n + 1U & 0xfffffffffffffffe) != uVar4);
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }